

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::diffuse_tensor_Vsync
          (Diffusion *this,MultiFab *Vsync,Real dt,Real be_cn_theta,MultiFab *rho_half,int rho_flag,
          MultiFab **param_7,int param_8,bool update_fluxreg)

{
  initializer_list<amrex::Geometry> iVar1;
  initializer_list<amrex::BoxArray> iVar2;
  initializer_list<amrex::DistributionMapping> iVar3;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> iVar4;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> iVar5;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> iVar6;
  initializer_list<amrex::MultiFab_*> iVar7;
  initializer_list<const_amrex::MultiFab_*> iVar8;
  bool bVar9;
  int iVar10;
  FabFactory<amrex::FArrayBox> *pFVar11;
  BoxArray *rhs_00;
  Geometry *__src;
  MultiFab *rhsscale_00;
  MultiFab **ppMVar12;
  AmrLevel *amr_level;
  ostream *os_;
  int in_ECX;
  MultiFab *in_RDX;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  byte in_stack_00000008;
  int k;
  MultiFab **tensorflux;
  FluxBoxes fb;
  Real s_norm;
  MLMG mlmg;
  MultiFab bcoefCC;
  int dir;
  MultiFab **face_bcoef;
  FluxBoxes fb_bcoef;
  int rho_comp;
  MultiFab *rho_1;
  pair<double,_double> scalars;
  MultiFab acoef;
  int i;
  Array<LinOpBCType,_3> mlmg_hibc [3];
  Array<LinOpBCType,_3> mlmg_lobc [3];
  MLEBTensorOp tensorop;
  EBFArrayBoxFactory **ebf;
  LPInfo info;
  Real tol_abs;
  Real tol_rel;
  MultiFab Soln;
  int soln_ng;
  Real rhsscale;
  Real b;
  Real a;
  Array4<const_double> *rho;
  Array4<double> *rhs;
  Box *bx;
  MFIter mfi;
  Real r_norm;
  MultiFab Rhs;
  char (*in_stack_ffffffffffffe6d8) [37];
  undefined4 in_stack_ffffffffffffe6e0;
  int in_stack_ffffffffffffe6e4;
  undefined4 in_stack_ffffffffffffe6e8;
  int in_stack_ffffffffffffe6ec;
  MLEBABecLap *in_stack_ffffffffffffe6f0;
  array<amrex::LinOpBCType,_3UL> *in_stack_ffffffffffffe6f8;
  Diffusion *in_stack_ffffffffffffe700;
  FabArrayBase *in_stack_ffffffffffffe708;
  MLLinOp *in_stack_ffffffffffffe710;
  Print *pPVar13;
  undefined4 in_stack_ffffffffffffe718;
  undefined4 in_stack_ffffffffffffe71c;
  MultiFab *in_stack_ffffffffffffe720;
  anon_class_128_2_4a81edf9 *in_stack_ffffffffffffe728;
  MLEBTensorOp *in_stack_ffffffffffffe730;
  MFIter *in_stack_ffffffffffffe740;
  Print *in_stack_ffffffffffffe750;
  Print *this_00;
  MultiFab *in_stack_ffffffffffffe758;
  MultiFab *pMVar14;
  AmrLevel *amr_level_00;
  FluxRegister *this_01;
  pair<double,_double> *in_stack_ffffffffffffe778;
  MultiFab *in_stack_ffffffffffffe780;
  MultiFab *in_stack_ffffffffffffe790;
  int in_stack_ffffffffffffe798;
  undefined8 **local_1838;
  undefined8 ****local_1820;
  int local_176c;
  FluxBoxes local_1760;
  undefined1 local_1751;
  undefined1 in_stack_ffffffffffffe9fe;
  undefined1 in_stack_ffffffffffffe9ff;
  int in_stack_ffffffffffffea00;
  int in_stack_ffffffffffffea04;
  MultiFab *in_stack_ffffffffffffea08;
  undefined1 *local_15b8;
  undefined1 **local_15b0;
  undefined8 local_15a8;
  char *in_stack_ffffffffffffea68;
  Real in_stack_ffffffffffffea70;
  Real in_stack_ffffffffffffea78;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol;
  MLMG *this_02;
  MLMG local_1550;
  undefined8 local_13b8;
  ostream *poStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  MultiFab *in_stack_ffffffffffffed30;
  int in_stack_ffffffffffffed3c;
  MultiFab **in_stack_ffffffffffffed40;
  MLEBTensorOp *in_stack_ffffffffffffed48;
  Diffusion *in_stack_ffffffffffffed50;
  int local_1204;
  FluxBoxes local_11f8;
  int local_11ec;
  MultiFab *local_11e8;
  pair<double,_double> local_11e0 [12];
  MultiFab *in_stack_ffffffffffffeee0;
  MultiFab *in_stack_ffffffffffffeee8;
  MultiFab *in_stack_ffffffffffffeef0;
  MultiFab *in_stack_ffffffffffffeef8;
  int in_stack_ffffffffffffef04;
  MLCellLinOp *in_stack_ffffffffffffef08;
  undefined8 local_1048;
  undefined4 local_1040;
  int local_103c [3];
  Real local_1030 [2];
  undefined8 *local_1020;
  Real local_1018;
  undefined8 local_ff1;
  undefined4 local_fe8;
  undefined8 local_fe4;
  undefined1 local_fdc [12];
  undefined4 local_fd0;
  undefined1 *local_fc8;
  Real local_fc0 [4];
  int local_f9c;
  undefined8 local_f98;
  undefined4 local_f90;
  int local_f8c [3];
  Real local_f80 [8];
  undefined8 local_f40 [2];
  undefined8 local_f30;
  undefined8 ***local_f08 [2];
  undefined1 ****local_ef8;
  int local_ef0 [10];
  undefined8 **local_ec8;
  undefined8 *local_ec0 [13];
  undefined8 **local_e58;
  undefined8 local_e50;
  undefined1 local_e28 [200];
  undefined1 *local_d60;
  undefined8 local_d58;
  pointer in_stack_fffffffffffff368;
  MultiFab *in_stack_fffffffffffff370;
  int in_stack_fffffffffffff378;
  int in_stack_fffffffffffff37c;
  pointer in_stack_fffffffffffff380;
  MultiFab *in_stack_fffffffffffff388;
  MLMG *in_stack_fffffffffffff390;
  long local_918;
  long *local_910;
  LPInfo local_908;
  undefined8 local_8e8;
  Real local_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  Print local_8a8;
  undefined8 local_720;
  double local_718;
  undefined8 local_710;
  undefined1 local_708 [64];
  undefined1 auStack_6c8 [64];
  Array4<double> local_688;
  Array4<const_double> local_648;
  Array4<const_double> *local_608;
  undefined1 local_600 [64];
  undefined1 *local_5c0;
  undefined1 local_5b4 [28];
  undefined1 *local_598;
  MFIter local_590;
  undefined1 local_529;
  Real local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined1 local_368 [795];
  byte local_4d;
  int local_3c;
  MultiFab *local_38;
  double local_30;
  double local_28;
  undefined4 local_c;
  int *local_8;
  
  local_28 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_4d = in_stack_00000008 & 1;
  local_3c = in_ECX;
  local_38 = in_RDX;
  local_30 = in_XMM1_Qa;
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print((Print *)in_stack_ffffffffffffe710,(ostream *)in_stack_ffffffffffffe708);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),
               in_stack_ffffffffffffe6d8);
    amrex::Print::~Print(in_stack_ffffffffffffe750);
  }
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_378 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x5c857d);
  pFVar11 = amrex::AmrLevel::Factory
                      ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
  amrex::MultiFab::MultiFab
            (in_stack_ffffffffffffe720,
             (BoxArray *)CONCAT44(in_stack_ffffffffffffe71c,in_stack_ffffffffffffe718),
             (DistributionMapping *)in_stack_ffffffffffffe710,
             (int)((ulong)in_stack_ffffffffffffe708 >> 0x20),(int)in_stack_ffffffffffffe708,
             (MFInfo *)in_stack_ffffffffffffe700,
             (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe730);
  amrex::MFInfo::~MFInfo((MFInfo *)0x5c85d3);
  amrex::MultiFab::Copy
            ((MultiFab *)in_stack_ffffffffffffe710,(MultiFab *)in_stack_ffffffffffffe708,
             (int)((ulong)in_stack_ffffffffffffe700 >> 0x20),(int)in_stack_ffffffffffffe700,
             (int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),(int)in_stack_ffffffffffffe6f8);
  if (1 < verbose) {
    local_3a0 = amrex::MultiFab::norm0
                          (in_stack_ffffffffffffea08,in_stack_ffffffffffffea04,
                           in_stack_ffffffffffffea00,(bool)in_stack_ffffffffffffe9ff,
                           (bool)in_stack_ffffffffffffe9fe);
    amrex::OutStream();
    amrex::Print::Print((Print *)in_stack_ffffffffffffe710,(ostream *)in_stack_ffffffffffffe708);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),
               (char (*) [23])pFVar11);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),
               (double *)pFVar11);
    local_529 = 10;
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),
               (char *)pFVar11);
    amrex::Print::~Print(in_stack_ffffffffffffe750);
  }
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            ((MFIter *)in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,
             SUB81((ulong)in_stack_ffffffffffffe700 >> 0x38,0));
  while (bVar9 = amrex::MFIter::isValid(&local_590), bVar9) {
    amrex::MFIter::tilebox(in_stack_ffffffffffffe740);
    local_598 = local_5b4;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),
               (MFIter *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
    local_5c0 = local_600;
    if (local_3c == 1) {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),
                 (MFIter *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
    }
    else {
      amrex::AmrLevel::get_old_data
                ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),
                 (int)((ulong)pFVar11 >> 0x20));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe6f0,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),
                 in_stack_ffffffffffffe6e4);
      amrex::Array4<const_double>::Array4<const_double,_0>(&local_648,&local_688);
    }
    local_608 = &local_648;
    memcpy(local_708,local_5c0,0x3c);
    memcpy(auStack_6c8,local_608,0x3c);
    amrex::
    ParallelFor<Diffusion::diffuse_tensor_Vsync(amrex::MultiFab&,double,double,amrex::MultiFab_const&,int,amrex::MultiFab_const*const*,int,bool)::__0>
              ((Box *)in_stack_ffffffffffffe730,in_stack_ffffffffffffe728);
    amrex::MFIter::operator++(&local_590);
  }
  amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
  local_710 = 0x3ff0000000000000;
  local_718 = local_30 * local_28;
  local_720 = 0x3ff0000000000000;
  local_8a8._388_4_ = 1;
  local_8c8 = 0;
  uStack_8c0 = 0;
  local_8d8 = 0;
  uStack_8d0 = 0;
  local_8b8 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x5c895b);
  rhs_00 = (BoxArray *)
           amrex::AmrLevel::Factory
                     ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
  amrex::MultiFab::MultiFab
            (in_stack_ffffffffffffe720,
             (BoxArray *)CONCAT44(in_stack_ffffffffffffe71c,in_stack_ffffffffffffe718),
             (DistributionMapping *)in_stack_ffffffffffffe710,
             (int)((ulong)in_stack_ffffffffffffe708 >> 0x20),(int)in_stack_ffffffffffffe708,
             (MFInfo *)in_stack_ffffffffffffe700,
             (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe730);
  amrex::MFInfo::~MFInfo((MFInfo *)0x5c89b6);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),(value_type)rhs_00);
  local_8e0 = visc_tol;
  local_8e8 = 0xbff0000000000000;
  amrex::LPInfo::LPInfo(&local_908);
  amrex::LPInfo::setAgglomeration(&local_908,(anonymous_namespace)::agglomeration != 0);
  amrex::LPInfo::setConsolidation(&local_908,(anonymous_namespace)::consolidation != 0);
  pFVar11 = amrex::AmrLevel::Factory
                      ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
  local_918 = __dynamic_cast(pFVar11,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_918 != 0) {
    local_910 = &local_918;
    __src = amrex::AmrLevel::Geom(*(AmrLevel **)(in_RDI + 8));
    memcpy(local_e28,__src,200);
    local_d58 = 1;
    local_d60 = local_e28;
    std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x5c8af0);
    iVar1._M_array._4_4_ = in_stack_ffffffffffffe6ec;
    iVar1._M_array._0_4_ = in_stack_ffffffffffffe6e8;
    iVar1._M_len = (size_type)in_stack_ffffffffffffe6f0;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),iVar1,
               (allocator_type *)rhs_00);
    local_ec8 = local_ec0;
    amrex::BoxArray::BoxArray
              ((BoxArray *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),rhs_00);
    local_e58 = local_ec0;
    local_e50 = 1;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x5c8b6b);
    iVar2._M_array._4_4_ = in_stack_ffffffffffffe6ec;
    iVar2._M_array._0_4_ = in_stack_ffffffffffffe6e8;
    iVar2._M_len = (size_type)in_stack_ffffffffffffe6f0;
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),iVar2,
               (allocator_type *)rhs_00);
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),
               (DistributionMapping *)rhs_00);
    local_ef0._0_8_ = 1;
    local_ef8 = (undefined1 ****)local_f08;
    std::allocator<amrex::DistributionMapping>::allocator
              ((allocator<amrex::DistributionMapping> *)0x5c8be4);
    iVar3._M_array._4_4_ = in_stack_ffffffffffffe6ec;
    iVar3._M_array._0_4_ = in_stack_ffffffffffffe6e8;
    iVar3._M_len = (size_type)in_stack_ffffffffffffe6f0;
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),iVar3,
               (allocator_type *)rhs_00);
    local_f40[0] = *local_910;
    local_f40[1] = local_f40;
    local_f30 = 1;
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x5c8c4f);
    iVar4._M_array._4_4_ = in_stack_ffffffffffffe6ec;
    iVar4._M_array._0_4_ = in_stack_ffffffffffffe6e8;
    iVar4._M_len = (size_type)in_stack_ffffffffffffe6f0;
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),iVar4,
           (allocator_type *)rhs_00);
    amrex::MLEBTensorOp::MLEBTensorOp
              (in_stack_ffffffffffffe730,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_ffffffffffffe728,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_ffffffffffffe720,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_ffffffffffffe71c,in_stack_ffffffffffffe718),
               (LPInfo *)in_stack_ffffffffffffe710,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)in_stack_ffffffffffffe708);
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    ~Vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
             *)0x5c8cba);
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::~allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x5c8cc7);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               0x5c8cd4);
    std::allocator<amrex::DistributionMapping>::~allocator
              ((allocator<amrex::DistributionMapping> *)0x5c8ce1);
    local_1820 = &local_ef8;
    do {
      local_1820 = local_1820 + -2;
      amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x5c8d16);
    } while (local_1820 != local_f08);
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x5c8d40);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x5c8d4d);
    local_1838 = &local_e58;
    do {
      local_1838 = local_1838 + -0xd;
      amrex::BoxArray::~BoxArray
                ((BoxArray *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
    } while (local_1838 != local_ec0);
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x5c8dac);
    std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x5c8db9);
    amrex::MLLinOp::setMaxOrder((MLLinOp *)&stack0xfffffffffffff2c8,tensor_max_order);
    for (local_f9c = 0; local_f9c < 3; local_f9c = local_f9c + 1) {
      setDomainBC(in_stack_ffffffffffffe700,in_stack_ffffffffffffe6f8,
                  (array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffe6f0,
                  in_stack_ffffffffffffe6ec);
    }
    local_fe8 = local_f80[4]._0_4_;
    stack0xfffffffffffff010 = local_f80[3];
    local_fdc._0_4_ = local_f80[5]._4_4_;
    local_fe4 = local_f80._36_8_;
    local_fd0 = local_f80[7]._0_4_;
    local_fdc._4_8_ = local_f80[6];
    local_fc8 = (undefined1 *)((long)&local_ff1 + 1);
    local_fc0[0] = 1.48219693752374e-323;
    this_01 = (FluxRegister *)&local_ff1;
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x5c90ff);
    iVar5._M_array._4_4_ = in_stack_ffffffffffffe6ec;
    iVar5._M_array._0_4_ = in_stack_ffffffffffffe6e8;
    iVar5._M_len = (size_type)in_stack_ffffffffffffe6f0;
    amrex::
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),iVar5,
             (allocator_type *)rhs_00);
    local_1040 = local_f90;
    local_1048 = local_f98;
    local_103c[2] = local_f8c[2];
    local_103c[0] = local_f8c[0];
    local_103c[1] = local_f8c[1];
    local_1030[1]._0_4_ = local_f80[1]._0_4_;
    local_1030[0] = local_f80[0];
    local_1020 = &local_1048;
    local_1018 = 1.48219693752374e-323;
    amr_level_00 = (AmrLevel *)&stack0xffffffffffffefb7;
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x5c91b1);
    iVar6._M_array._4_4_ = in_stack_ffffffffffffe6ec;
    iVar6._M_array._0_4_ = in_stack_ffffffffffffe6e8;
    iVar6._M_len = (size_type)in_stack_ffffffffffffe6f0;
    amrex::
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),iVar6,
             (allocator_type *)rhs_00);
    iVar10 = (int)((ulong)rhs_00 >> 0x20);
    amrex::MLLinOp::setDomainBC
              (in_stack_ffffffffffffe710,
               (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)in_stack_ffffffffffffe708,
               (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)in_stack_ffffffffffffe700);
    amrex::
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::~Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)0x5c9202);
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::~allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x5c920f);
    amrex::
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::~Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)0x5c921c);
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::~allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x5c9229);
    if (0 < *(int *)(in_RDI + 0x20)) {
      local_8 = (int *)(in_RDI + 0x3c);
      local_c = 0;
      amrex::MLLinOp::setCoarseFineBC((MLLinOp *)&stack0xfffffffffffff2c8,(MultiFab *)0x0,*local_8);
    }
    amrex::MLCellLinOp::setLevelBC
              (in_stack_ffffffffffffef08,in_stack_ffffffffffffef04,in_stack_ffffffffffffeef8,
               in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0);
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
    std::pair<double,_double>::pair<double,_double,_true>(local_11e0);
    rhsscale_00 = local_38;
    if (local_3c != 1) {
      rhsscale_00 = amrex::AmrLevel::get_new_data
                              ((AmrLevel *)
                               CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),iVar10)
      ;
    }
    iVar10 = (uint)(local_3c != 1) + (uint)(local_3c != 1) * 2;
    pMVar14 = rhsscale_00;
    local_11ec = iVar10;
    local_11e8 = rhsscale_00;
    computeAlpha(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,(Real)this_01,
                 (Real)amr_level_00,(Real *)rhsscale_00,in_stack_ffffffffffffe758,
                 (int)((ulong)in_stack_ffffffffffffe750 >> 0x20),(int)in_stack_ffffffffffffe750,
                 in_stack_ffffffffffffe790,in_stack_ffffffffffffe798);
    amrex::MLEBABecLap::setScalars
              (in_stack_ffffffffffffe6f0,
               (Real)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),
               (Real)CONCAT44(in_stack_ffffffffffffe6e4,iVar10));
    amrex::MLEBABecLap::setACoeffs
              (in_stack_ffffffffffffe6f0,in_stack_ffffffffffffe6ec,
               (MultiFab *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10));
    amrex::MultiFab::~MultiFab((MultiFab *)0x5c940f);
    FluxBoxes::FluxBoxes(&local_11f8);
    ppMVar12 = FluxBoxes::define((FluxBoxes *)this_01,amr_level_00,(int)((ulong)pMVar14 >> 0x20),
                                 (int)pMVar14);
    for (local_1204 = 0; local_1204 < 3; local_1204 = local_1204 + 1) {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10),
                 (value_type)rhsscale_00);
    }
    local_13a8._0_1_ = (ostringstream)0x0;
    local_13a8._1_7_ = 0;
    uStack_13a0 = 0;
    local_13b8._0_4_ = 0;
    local_13b8._4_4_ = 0;
    poStack_13b0 = (ostream *)0x0;
    local_1398 = 0;
    this_00 = (Print *)&local_13b8;
    amrex::MFInfo::MFInfo((MFInfo *)0x5c953b);
    amr_level = (AmrLevel *)
                amrex::AmrLevel::Factory((AmrLevel *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10));
    amrex::MultiFab::MultiFab
              (in_stack_ffffffffffffe720,
               (BoxArray *)CONCAT44(in_stack_ffffffffffffe71c,in_stack_ffffffffffffe718),
               (DistributionMapping *)in_stack_ffffffffffffe710,
               (int)((ulong)in_stack_ffffffffffffe708 >> 0x20),(int)in_stack_ffffffffffffe708,
               (MFInfo *)in_stack_ffffffffffffe700,
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe730);
    amrex::MFInfo::~MFInfo((MFInfo *)0x5c9588);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10),
               (value_type)amr_level);
    setViscosity(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                 in_stack_ffffffffffffed3c,in_stack_ffffffffffffed30);
    amrex::MultiFab::~MultiFab((MultiFab *)0x5c95d5);
    FluxBoxes::~FluxBoxes((FluxBoxes *)0x5c95e2);
    amrex::MLMG::MLMG((MLMG *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10),(MLLinOp *)amr_level);
    if ((anonymous_namespace)::use_hypre != 0) {
      amrex::MLMG::setBottomSolver(&local_1550,hypre);
      amrex::MLMG::setBottomVerbose(&local_1550,(anonymous_namespace)::hypre_verbose);
    }
    amrex::MLMG::setMaxFmgIter(&local_1550,(anonymous_namespace)::max_fmg_iter);
    amrex::MLMG::setVerbose(&local_1550,verbose);
    amrex::MultiFab::mult
              ((MultiFab *)in_stack_ffffffffffffe6f0,
               (Real)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8),
               in_stack_ffffffffffffe6e4,iVar10,(int)((ulong)amr_level >> 0x20));
    amrex::MLMG::setFinalFillBC(&local_1550,1);
    pPVar13 = &local_8a8;
    a_sol = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
            &stack0xffffffffffffea80;
    this_02 = (MLMG *)0x1;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x5c9718);
    iVar7._M_array._4_4_ = in_stack_ffffffffffffe6ec;
    iVar7._M_array._0_4_ = in_stack_ffffffffffffe6e8;
    iVar7._M_len = (size_type)in_stack_ffffffffffffe6f0;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_ffffffffffffe6e4,iVar10),iVar7,(allocator_type *)amr_level);
    local_15b8 = local_368;
    local_15b0 = &local_15b8;
    local_15a8 = 1;
    std::allocator<const_amrex::MultiFab_*>::allocator
              ((allocator<const_amrex::MultiFab_*> *)0x5c977a);
    iVar8._M_array._4_4_ = in_stack_ffffffffffffe6ec;
    iVar8._M_array._0_4_ = in_stack_ffffffffffffe6e8;
    iVar8._M_len = (size_type)in_stack_ffffffffffffe6f0;
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_ffffffffffffe6e4,iVar10),iVar8,(allocator_type *)amr_level);
    amrex::MLMG::solve(this_02,a_sol,
                       (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                       pPVar13,in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
                       in_stack_ffffffffffffea68);
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x5c97df
              );
    std::allocator<const_amrex::MultiFab_*>::~allocator
              ((allocator<const_amrex::MultiFab_*> *)0x5c97ec);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x5c97f9);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x5c9806);
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_ffffffffffffe710,(MultiFab *)in_stack_ffffffffffffe708,
               (int)((ulong)in_stack_ffffffffffffe700 >> 0x20),(int)in_stack_ffffffffffffe700,
               (int)((ulong)in_stack_ffffffffffffe6f8 >> 0x20),(int)in_stack_ffffffffffffe6f8);
    if (1 < verbose) {
      pPVar13 = &local_8a8;
      amrex::FabArrayBase::nGrow((FabArrayBase *)pPVar13,0);
      amrex::MultiFab::norm0
                (in_stack_ffffffffffffea08,in_stack_ffffffffffffea04,in_stack_ffffffffffffea00,
                 (bool)in_stack_ffffffffffffe9ff,(bool)in_stack_ffffffffffffe9fe);
      os_ = amrex::OutStream();
      amrex::Print::Print(pPVar13,os_);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10),(char (*) [20])amr_level);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10),(double *)amr_level);
      local_1751 = 10;
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10),(char *)amr_level);
      amrex::Print::~Print(this_00);
    }
    if (0 < *(int *)(in_RDI + 0x20)) {
      FluxBoxes::FluxBoxes
                ((FluxBoxes *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10),amr_level,0,0x5c99ee);
      FluxBoxes::get(&local_1760);
      computeExtensiveFluxes
                (in_stack_fffffffffffff390,in_stack_fffffffffffff388,
                 (MultiFab **)in_stack_fffffffffffff380,in_stack_fffffffffffff37c,
                 in_stack_fffffffffffff378,in_stack_fffffffffffff370,(Real)in_stack_fffffffffffff368
                );
      if ((local_4d & 1) != 0) {
        for (local_176c = 0; local_176c < 3; local_176c = local_176c + 1) {
          amrex::FluxRegister::FineAdd
                    (this_01,(MultiFab *)amr_level_00,(int)((ulong)pMVar14 >> 0x20),(int)pMVar14,
                     (int)((ulong)ppMVar12 >> 0x20),(int)ppMVar12,(Real)this_00);
        }
      }
      FluxBoxes::~FluxBoxes((FluxBoxes *)0x5c9b0d);
    }
    amrex::MLMG::~MLMG((MLMG *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10));
    amrex::MLEBTensorOp::~MLEBTensorOp((MLEBTensorOp *)CONCAT44(in_stack_ffffffffffffe6e4,iVar10));
    amrex::MultiFab::~MultiFab((MultiFab *)0x5c9b34);
    amrex::MultiFab::~MultiFab((MultiFab *)0x5c9b41);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
Diffusion::diffuse_tensor_Vsync (MultiFab&              Vsync,
                                 Real                   dt,
                                 Real                   be_cn_theta,
                                 const MultiFab&        rho_half,
                                 int                    rho_flag,
                                 const MultiFab* const* /*beta*/,
                                 int                    /*betaComp*/,
                                 bool                   update_fluxreg)
{
    BL_ASSERT(rho_flag == 1 || rho_flag == 3);

    if (verbose) amrex::Print() << "Diffusion::diffuse_tensor_Vsync ...\n";

    MultiFab Rhs(grids,dmap,AMREX_SPACEDIM,0,MFInfo(),navier_stokes->Factory());

    MultiFab::Copy(Rhs,Vsync,0,0,AMREX_SPACEDIM,0);

    if (verbose > 1)
    {
        Real r_norm = Rhs.norm0();
        amrex::Print() << "Original max of Vsync " << r_norm << '\n';
    }

    //
    // Multiply RHS by density.
    //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Rhs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& rhs = Rhs.array(mfi);
       auto const& rho = (rho_flag == 1) ? rho_half.array(mfi) : navier_stokes->get_old_data(State_Type).array(mfi,Density);

       amrex::ParallelFor(bx, [rhs, rho]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          for (int n = 0; n < AMREX_SPACEDIM; n++) {
             rhs(i,j,k,n) *= rho(i,j,k);
          }
       });
    }

    //
    // SET UP COEFFICIENTS FOR VISCOUS SOLVER.
    //
    const Real      a         = 1.0;
    const Real      b         = be_cn_theta*dt;
    Real rhsscale = 1.0;

    int soln_ng = 1;
    MultiFab Soln(grids,dmap,AMREX_SPACEDIM,soln_ng, MFInfo(),navier_stokes->Factory());
    Soln.setVal(0.0);

    // MLMG
    const Real tol_rel = visc_tol;
    const Real tol_abs = -1;

    LPInfo info;
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);
    //info.setMaxCoarseningLevel(100);

#ifdef AMREX_USE_EB
    const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
    MLEBTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
    MLTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info);
#endif

    tensorop.setMaxOrder(tensor_max_order);

    // create right container
    Array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc[AMREX_SPACEDIM];
    Array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc[AMREX_SPACEDIM];
    // fill it
    for (int i=0; i<AMREX_SPACEDIM; i++)
      setDomainBC(mlmg_lobc[i], mlmg_hibc[i], Xvel+i);
    // pass to op
    tensorop.setDomainBC({AMREX_D_DECL(mlmg_lobc[0],mlmg_lobc[1],mlmg_lobc[2])},
                         {AMREX_D_DECL(mlmg_hibc[0],mlmg_hibc[1],mlmg_hibc[2])});

    // set up level BCs
    if (level > 0) {
      tensorop.setCoarseFineBC(nullptr, crse_ratio[0]);
    }
    tensorop.setLevelBC(0, nullptr);

    {
      MultiFab acoef;
      std::pair<Real,Real> scalars;
      const MultiFab& rho = (rho_flag == 1) ? rho_half : navier_stokes->get_new_data(State_Type);
      const int rho_comp = (rho_flag == 1) ? 0 : Density;
      computeAlpha(acoef, scalars, a, b,
                   &rhsscale, nullptr, 0,
                   rho_flag, &rho, rho_comp);
      tensorop.setScalars(scalars.first, scalars.second);
      tensorop.setACoeffs(0, acoef);
    }

    {
      FluxBoxes  fb_bcoef;
      MultiFab** face_bcoef = 0;
      face_bcoef = fb_bcoef.define(navier_stokes);
      for (int dir=0; dir<AMREX_SPACEDIM; dir++) {
         face_bcoef[dir]->setVal(1.0);
      }

#ifdef AMREX_USE_EB
      MultiFab bcoefCC(grids,dmap,1,0,MFInfo(),navier_stokes->Factory());
      bcoefCC.setVal(1.0);
      setViscosity(tensorop, face_bcoef, 0, bcoefCC);
#else
      setViscosity(tensorop, face_bcoef, 0);
#endif
    }

    MLMG mlmg(tensorop);
    //fixme?
    //mlmg.setMaxIter(max_iter);
    //mlmg.setBottomVerbose(bottom_verbose);
    if (use_hypre) {
       mlmg.setBottomSolver(MLMG::BottomSolver::hypre);
       mlmg.setBottomVerbose(hypre_verbose);
    }
    mlmg.setMaxFmgIter(max_fmg_iter);
    mlmg.setVerbose(verbose);

    Rhs.mult(rhsscale,0,1);

    mlmg.setFinalFillBC(true);
    mlmg.solve({&Soln}, {&Rhs}, tol_rel, tol_abs);

    //
    // Copy into state variable at new time.
    //
    MultiFab::Copy(Vsync,Soln,0,0,AMREX_SPACEDIM,soln_ng);

    if (verbose > 1)
    {
        Real s_norm = Soln.norm0(0,Soln.nGrow());
        amrex::Print() << "Final max of Vsync " << s_norm << '\n';
    }

    if (level > 0)
    {
        FluxBoxes fb(navier_stokes, AMREX_SPACEDIM);
        MultiFab** tensorflux = fb.get();
        //
        // The extra factor of dt comes from the fact that Vsync looks
        // like dV/dt, not just an increment to V.
        //
        computeExtensiveFluxes(mlmg, Soln, tensorflux, 0, AMREX_SPACEDIM,
			       navier_stokes->area, b/dt);

        if (update_fluxreg)
        {
           for (int k = 0; k < AMREX_SPACEDIM; k++) {
              viscflux_reg->FineAdd(*(tensorflux[k]),k,Xvel,Xvel,AMREX_SPACEDIM,dt*dt);
           }
        }
    }
}